

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# own_as_range.hpp
# Opt level: O1

iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>_>
* __thiscall
burst::own_as_range_t::operator()
          (iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>_>
           *__return_storage_ptr__,own_as_range_t *this,
          vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
          *container)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  local_40;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  pointer local_18;
  
  local_40.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_40.m_container.
   super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_40.m_container.
   super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_40.m_container.
   super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_003a5cc0;
  local_40.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_40.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_18 = (container->
             super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_40.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_18;
  *(pointer *)
   &local_40.m_container.
    super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._M_use_count =
       (container->
       super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_40.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base =
       (_func_int **)
       (container->
       super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (container->
  super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (container->
  super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (container->
  super__Vector_base<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_40.m_container.
     super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_40.m_container.
          super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_40.m_container.
     super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count = 2;
  }
  local_40.m_iterator._M_current =
       *(iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>
         **)&local_40.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi[1]._M_use_count;
  local_28 = (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
              *)local_40.m_container.
                super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  local_20 = local_40.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  boost::
  make_iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>>>>>
            (__return_storage_ptr__,(boost *)&local_28,&local_40,
             (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
              *)local_40.m_container.
                super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr);
  if (local_40.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container && container) const
        {
            auto begin = make_owning_iterator(std::forward<Container>(container));
            auto end = make_owning_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }